

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISInputManager.cpp
# Opt level: O3

void __thiscall OIS::InputManager::destroyInputObject(InputManager *this,Object *obj)

{
  _Base_ptr p_Var1;
  undefined8 *puVar2;
  _Rb_tree_header *p_Var3;
  iterator __position;
  
  if (obj == (Object *)0x0) {
    return;
  }
  p_Var1 = (this->mFactoryObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var3 = &(this->mFactoryObjects)._M_t._M_impl.super__Rb_tree_header;
    __position._M_node = &p_Var3->_M_header;
    do {
      if (*(Object **)(p_Var1 + 1) >= obj) {
        __position._M_node = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[*(Object **)(p_Var1 + 1) < obj];
    } while (p_Var1 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__position._M_node != p_Var3) &&
       (*(Object **)(__position._M_node + 1) <= obj)) {
      (**(code **)(*(long *)__position._M_node[1]._M_parent + 0x38))();
      std::
      _Rb_tree<OIS::Object*,std::pair<OIS::Object*const,OIS::FactoryCreator*>,std::_Select1st<std::pair<OIS::Object*const,OIS::FactoryCreator*>>,std::less<OIS::Object*>,std::allocator<std::pair<OIS::Object*const,OIS::FactoryCreator*>>>
      ::erase_abi_cxx11_((_Rb_tree<OIS::Object*,std::pair<OIS::Object*const,OIS::FactoryCreator*>,std::_Select1st<std::pair<OIS::Object*const,OIS::FactoryCreator*>>,std::less<OIS::Object*>,std::allocator<std::pair<OIS::Object*const,OIS::FactoryCreator*>>>
                          *)&this->mFactoryObjects,__position);
      return;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x20);
  *puVar2 = &PTR__exception_001228d0;
  puVar2[1] = 0xf500000008;
  puVar2[2] = 
  "/workspace/llm4binary/github/license_c_cmakelists/wgois[P]OIS/src/OISInputManager.cpp";
  puVar2[3] = "Object creator not known.";
  __cxa_throw(puVar2,&Exception::typeinfo,std::exception::~exception);
}

Assistant:

void InputManager::destroyInputObject(Object* obj)
{
	if(obj == nullptr)
		return;

	FactoryCreatedObject::iterator i = mFactoryObjects.find(obj);
	if(i != mFactoryObjects.end())
	{
		i->second->destroyObject(obj);
		mFactoryObjects.erase(i);
	}
	else
	{
		OIS_EXCEPT(E_General, "Object creator not known.");
	}
}